

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

off_t cm_zlib_gzseek64(gzFile file,off_t offset,int whence)

{
  int iVar1;
  __off_t _Var2;
  uint local_3c;
  gz_statep state;
  off_t ret;
  uint n;
  int whence_local;
  off_t offset_local;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local = (gzFile)0xffffffffffffffff;
  }
  else if ((file[1].have == 0x1c4f) || (file[1].have == 0x79b1)) {
    if ((*(int *)((long)&file[4].pos + 4) == 0) || (*(int *)((long)&file[4].pos + 4) == -5)) {
      if ((whence == 0) || (whence == 1)) {
        if (whence == 0) {
          _n = (uchar *)(offset - file->pos);
        }
        else {
          _n = (uchar *)offset;
          if ((int)file[4].pos != 0) {
            _n = file[4].next + offset;
          }
        }
        *(undefined4 *)&file[4].pos = 0;
        if (((file[1].have == 0x1c4f) && (*(int *)((long)&file[2].pos + 4) == 1)) &&
           (-1 < (long)(_n + file->pos))) {
          _Var2 = lseek(*(int *)&file[1].field_0x4,(long)_n - (ulong)file->have,1);
          if (_Var2 == -1) {
            file_local = (gzFile)0xffffffffffffffff;
          }
          else {
            file->have = 0;
            *(undefined4 *)&file[3].next = 0;
            *(undefined4 *)((long)&file[3].next + 4) = 0;
            *(undefined4 *)&file[4].pos = 0;
            cm_zlib_gz_error((gz_statep)file,0,(char *)0x0);
            *(undefined4 *)&file[5].pos = 0;
            file->pos = (off_t)(_n + file->pos);
            file_local = (gzFile)file->pos;
          }
        }
        else {
          if ((long)_n < 0) {
            if (file[1].have != 0x1c4f) {
              return -1;
            }
            _n = _n + file->pos;
            if ((long)_n < 0) {
              return -1;
            }
            iVar1 = cm_zlib_gzrewind(file);
            if (iVar1 == -1) {
              return -1;
            }
          }
          if (file[1].have == 0x1c4f) {
            if ((long)_n < (long)(ulong)file->have) {
              local_3c = (uint)_n;
            }
            else {
              local_3c = file->have;
            }
            file->have = file->have - local_3c;
            file->next = file->next + local_3c;
            file->pos = (ulong)local_3c + file->pos;
            _n = _n + -(ulong)local_3c;
          }
          if (_n != (uchar *)0x0) {
            *(undefined4 *)&file[4].pos = 1;
            file[4].next = _n;
          }
          file_local = (gzFile)(_n + file->pos);
        }
      }
      else {
        file_local = (gzFile)0xffffffffffffffff;
      }
    }
    else {
      file_local = (gzFile)0xffffffffffffffff;
    }
  }
  else {
    file_local = (gzFile)0xffffffffffffffff;
  }
  return (off_t)file_local;
}

Assistant:

z_off64_t ZEXPORT gzseek64(gzFile file, z_off64_t offset, int whence) {
    unsigned n;
    z_off64_t ret;
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* check that there's no error */
    if (state->err != Z_OK && state->err != Z_BUF_ERROR)
        return -1;

    /* can only seek from start or relative to current position */
    if (whence != SEEK_SET && whence != SEEK_CUR)
        return -1;

    /* normalize offset to a SEEK_CUR specification */
    if (whence == SEEK_SET)
        offset -= state->x.pos;
    else if (state->seek)
        offset += state->skip;
    state->seek = 0;

    /* if within raw area while reading, just go there */
    if (state->mode == GZ_READ && state->how == COPY &&
            state->x.pos + offset >= 0) {
        ret = LSEEK(state->fd, offset - (z_off64_t)state->x.have, SEEK_CUR);
        if (ret == -1)
            return -1;
        state->x.have = 0;
        state->eof = 0;
        state->past = 0;
        state->seek = 0;
        gz_error(state, Z_OK, NULL);
        state->strm.avail_in = 0;
        state->x.pos += offset;
        return state->x.pos;
    }

    /* calculate skip amount, rewinding if needed for back seek when reading */
    if (offset < 0) {
        if (state->mode != GZ_READ)         /* writing -- can't go backwards */
            return -1;
        offset += state->x.pos;
        if (offset < 0)                     /* before start of file! */
            return -1;
        if (gzrewind(file) == -1)           /* rewind, then skip to offset */
            return -1;
    }

    /* if reading, skip what's in output buffer (one less gzgetc() check) */
    if (state->mode == GZ_READ) {
        n = GT_OFF(state->x.have) || (z_off64_t)state->x.have > offset ?
            (unsigned)offset : state->x.have;
        state->x.have -= n;
        state->x.next += n;
        state->x.pos += n;
        offset -= n;
    }

    /* request skip (if not zero) */
    if (offset) {
        state->seek = 1;
        state->skip = offset;
    }
    return state->x.pos + offset;
}